

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_refcounted.hpp
# Opt level: O2

intrusive_ptr_t<so_5::abstract_message_chain_t> * __thiscall
so_5::intrusive_ptr_t<so_5::abstract_message_chain_t>::operator=
          (intrusive_ptr_t<so_5::abstract_message_chain_t> *this,
          intrusive_ptr_t<so_5::abstract_message_chain_t> *o)

{
  if (o != this) {
    dismiss_object(this);
    this->m_obj = o->m_obj;
    o->m_obj = (abstract_message_chain_t *)0x0;
  }
  return this;
}

Assistant:

intrusive_ptr_t &
		operator=( intrusive_ptr_t && o )
		{
			if( &o != this )
			{
				dismiss_object();
				m_obj = o.m_obj;
				o.m_obj = nullptr;
			}
			return *this;
		}